

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O3

void Curl_expire(SessionHandle *data,long milli)

{
  timeval *stamp;
  timeval *ptVar1;
  Curl_multi *pCVar2;
  curl_llist *pcVar3;
  uint uVar4;
  Curl_tree *pCVar5;
  long lVar6;
  timeval tVar7;
  timeval local_30;
  
  pCVar2 = data->multi;
  if (pCVar2 != (Curl_multi *)0x0) {
    stamp = &(data->state).expiretime;
    if (milli == 0) {
      if ((stamp->tv_sec != 0) || ((data->state).expiretime.tv_usec != 0)) {
        pcVar3 = (data->state).timeoutlist;
        uVar4 = Curl_splayremovebyaddr(pCVar2->timetree,&(data->state).timenode,&pCVar2->timetree);
        if (uVar4 != 0) {
          Curl_infof(data,"Internal error clearing splay node = %d\n",(ulong)uVar4);
        }
        while (pcVar3->size != 0) {
          Curl_llist_remove(pcVar3,pcVar3->tail,(void *)0x0);
        }
        stamp->tv_sec = 0;
        (data->state).expiretime.tv_usec = 0;
      }
    }
    else {
      tVar7 = curlx_tvnow();
      local_30.tv_sec = tVar7.tv_sec + milli / 1000;
      local_30.tv_usec = (milli % 1000) * 1000 + tVar7.tv_usec;
      if (999999 < local_30.tv_usec) {
        local_30.tv_sec = local_30.tv_sec + 1;
        local_30.tv_usec = local_30.tv_usec + -1000000;
      }
      ptVar1 = &(data->state).expiretime;
      if (ptVar1->tv_sec != 0 || (data->state).expiretime.tv_usec != 0) {
        tVar7.tv_usec = local_30.tv_usec;
        tVar7.tv_sec = local_30.tv_sec;
        lVar6 = curlx_tvdiff(tVar7,*ptVar1);
        pcVar3 = (data->state).timeoutlist;
        if (0 < lVar6) {
          multi_addtimeout(pcVar3,&local_30);
          return;
        }
        multi_addtimeout(pcVar3,stamp);
        uVar4 = Curl_splayremovebyaddr(pCVar2->timetree,&(data->state).timenode,&pCVar2->timetree);
        if (uVar4 != 0) {
          Curl_infof(data,"Internal error removing splay node = %d\n",(ulong)uVar4);
        }
      }
      stamp->tv_sec = local_30.tv_sec;
      (data->state).expiretime.tv_usec = local_30.tv_usec;
      (data->state).timenode.payload = data;
      pCVar5 = Curl_splayinsert((data->state).expiretime,pCVar2->timetree,&(data->state).timenode);
      pCVar2->timetree = pCVar5;
    }
  }
  return;
}

Assistant:

void Curl_expire(struct SessionHandle *data, long milli)
{
  struct Curl_multi *multi = data->multi;
  struct timeval *nowp = &data->state.expiretime;
  int rc;

  /* this is only interesting while there is still an associated multi struct
     remaining! */
  if(!multi)
    return;

  if(!milli) {
    /* No timeout, clear the time data. */
    if(nowp->tv_sec || nowp->tv_usec) {
      /* Since this is an cleared time, we must remove the previous entry from
         the splay tree */
      struct curl_llist *list = data->state.timeoutlist;

      rc = Curl_splayremovebyaddr(multi->timetree,
                                  &data->state.timenode,
                                  &multi->timetree);
      if(rc)
        infof(data, "Internal error clearing splay node = %d\n", rc);

      /* flush the timeout list too */
      while(list->size > 0)
        Curl_llist_remove(list, list->tail, NULL);

#ifdef DEBUGBUILD
      infof(data, "Expire cleared\n");
#endif
      nowp->tv_sec = 0;
      nowp->tv_usec = 0;
    }
  }
  else {
    struct timeval set;

    set = Curl_tvnow();
    set.tv_sec += milli/1000;
    set.tv_usec += (milli%1000)*1000;

    if(set.tv_usec >= 1000000) {
      set.tv_sec++;
      set.tv_usec -= 1000000;
    }

    if(nowp->tv_sec || nowp->tv_usec) {
      /* This means that the struct is added as a node in the splay tree.
         Compare if the new time is earlier, and only remove-old/add-new if it
         is. */
      long diff = curlx_tvdiff(set, *nowp);
      if(diff > 0) {
        /* the new expire time was later so just add it to the queue
           and get out */
        multi_addtimeout(data->state.timeoutlist, &set);
        return;
      }

      /* the new time is newer than the presently set one, so add the current
         to the queue and update the head */
      multi_addtimeout(data->state.timeoutlist, nowp);

      /* Since this is an updated time, we must remove the previous entry from
         the splay tree first and then re-add the new value */
      rc = Curl_splayremovebyaddr(multi->timetree,
                                  &data->state.timenode,
                                  &multi->timetree);
      if(rc)
        infof(data, "Internal error removing splay node = %d\n", rc);
    }

    *nowp = set;
    data->state.timenode.payload = data;
    multi->timetree = Curl_splayinsert(*nowp,
                                       multi->timetree,
                                       &data->state.timenode);
  }
#if 0
  Curl_splayprint(multi->timetree, 0, TRUE);
#endif
}